

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

bool __thiscall
TasGrid::GridWavelet::addParent(GridWavelet *this,int *point,int direction,Data2D<int> *destination)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int c;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_51;
  Data2D<int> *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_50 = destination;
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_48,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_51);
  iVar3 = RuleWavelet::getParent(&this->rule1D,point[direction]);
  local_48._M_impl.super__Vector_impl_data._M_start[direction] = iVar3;
  if (iVar3 == -2) {
    bVar2 = false;
    iVar3 = 0;
    while( true ) {
      iVar4 = RuleWavelet::getNumPoints(&this->rule1D,0);
      if (iVar4 <= iVar3) break;
      local_48._M_impl.super__Vector_impl_data._M_start[direction] = iVar3;
      bVar1 = MultiIndexSet::missing
                        (&(this->super_BaseCanonicalGrid).points,
                         (vector<int,_std::allocator<int>_> *)&local_48);
      if (bVar1) {
        bVar2 = true;
        Data2D<int>::appendStrip(local_50,(vector<int,_std::allocator<int>_> *)&local_48);
      }
      iVar3 = iVar3 + 1;
    }
  }
  else {
    if (-1 < iVar3) {
      bVar2 = MultiIndexSet::missing
                        (&(this->super_BaseCanonicalGrid).points,
                         (vector<int,_std::allocator<int>_> *)&local_48);
      if (bVar2) {
        bVar2 = true;
        Data2D<int>::appendStrip(local_50,(vector<int,_std::allocator<int>_> *)&local_48);
        goto LAB_00185386;
      }
    }
    bVar2 = false;
  }
LAB_00185386:
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return bVar2;
}

Assistant:

bool GridWavelet::addParent(const int point[], int direction, Data2D<int> &destination) const{
    std::vector<int> dad(point, point + num_dimensions);
    bool added = false;
    dad[direction] = rule1D.getParent(point[direction]);
    if (dad[direction] == -2){
        for(int c=0; c<rule1D.getNumPoints(0); c++){
            dad[direction] = c;
            if (points.missing(dad)){
                destination.appendStrip(dad);
                added = true;
            }
        }
    }else if (dad[direction] >= 0){
        if (points.missing(dad)){
            destination.appendStrip(dad);
            added = true;
        }
    }
    return added;
}